

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

itemstruct_t * find_nearby_item(tgestate_t *state)

{
  bool bVar1;
  int iVar2;
  itemstruct_t *piVar3;
  char cVar4;
  mappos8_t *pmVar5;
  mappos8_t *pmVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  iVar2 = (uint)(state->room_index != '\0') * 5 + 1;
  piVar3 = state->item_structs;
  cVar4 = '\x10';
  do {
    if ((char)piVar3->room_and_flags < '\0') {
      pmVar5 = &piVar3->mappos;
      bVar7 = true;
      pmVar6 = &state->hero_mappos;
      do {
        bVar1 = (int)((uint)pmVar6->u - iVar2) < (int)(uint)pmVar5->u;
        bVar9 = (uint)pmVar5->u <= (uint)pmVar6->u + iVar2;
        bVar8 = bVar9 && bVar1;
        if (!bVar7) break;
        pmVar6 = (mappos8_t *)&pmVar6->v;
        pmVar5 = (mappos8_t *)(&pmVar5->u + bVar8);
        bVar7 = false;
      } while (bVar8);
      if (bVar9 && bVar1) {
        return piVar3;
      }
    }
    piVar3 = piVar3 + 1;
    cVar4 = cVar4 + -1;
    if (cVar4 == '\0') {
      return (itemstruct_t *)0x0;
    }
  } while( true );
}

Assistant:

itemstruct_t *find_nearby_item(tgestate_t *state)
{
  uint8_t       radius;  /* was C */
  uint8_t       iters;   /* was B */
  itemstruct_t *itemstr; /* was HL */

  assert(state != NULL);

  /* Select a pick up radius. */
  radius = 1; /* Outdoors. */
  if (state->room_index > room_0_OUTDOORS)
    radius = 6; /* Indoors. */

  /* For all items. */
  iters   = item__LIMIT;
  itemstr = &state->item_structs[0];
  do
  {
    if (itemstr->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
    {
      uint8_t *structcoord; /* was HL */
      uint8_t *herocoord;   /* was DE */
      uint8_t  coorditers;  /* was B */

      // FUTURE: Candidate for loop unrolling.
      structcoord = &itemstr->mappos.u;
      herocoord   = &state->hero_mappos.u;
      coorditers = 2;
      /* Range check. */
      do
      {
        uint8_t A;

        A = *herocoord++; /* get hero map position */
        if (A - radius >= *structcoord || A + radius < *structcoord)
          goto next;
        structcoord++;
      }
      while (--coorditers);

      return itemstr;
    }

next:
    itemstr++;
  }
  while (--iters);

  return NULL;
}